

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  Value *in_RSI;
  Value *in_RDI;
  
  swapPayload(in_RSI,in_RDI);
  std::swap<Json::Value::Comments>((Comments *)in_RSI,(Comments *)in_RDI);
  std::swap<long>(&in_RDI->start_,&in_RSI->start_);
  std::swap<long>(&in_RDI->limit_,&in_RSI->limit_);
  return;
}

Assistant:

void Value::swap(Value& other) {
  swapPayload(other);
  std::swap(comments_, other.comments_);
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}